

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# easy.c
# Opt level: O2

CURLcode curl_easy_getinfo(Curl_easy *data,CURLINFO info,...)

{
  CURLcode CVar1;
  va_list arg;
  undefined8 local_a8;
  
  CVar1 = Curl_getinfo(data,info,local_a8);
  return CVar1;
}

Assistant:

CURLcode curl_easy_getinfo(struct Curl_easy *data, CURLINFO info, ...)
{
  va_list arg;
  void *paramp;
  CURLcode result;

  va_start(arg, info);
  paramp = va_arg(arg, void *);

  result = Curl_getinfo(data, info, paramp);

  va_end(arg);
  return result;
}